

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_hash nk_murmur_hash(void *key,int len,nk_hash seed)

{
  uint uVar1;
  byte *pbVar2;
  int local_5c;
  int i;
  nk_byte *tail;
  nk_uint c2;
  nk_uint c1;
  int nblocks;
  int bsize;
  nk_byte *k1ptr;
  nk_byte *keyptr;
  nk_byte *data;
  nk_uint k1;
  nk_uint h1;
  nk_hash seed_local;
  int len_local;
  void *key_local;
  
  if (key == (void *)0x0) {
    return 0;
  }
  k1ptr = (nk_byte *)key;
  data._4_4_ = seed;
  for (local_5c = 0; local_5c < len / 4; local_5c = local_5c + 1) {
    data._0_1_ = *k1ptr;
    data._1_1_ = k1ptr[1];
    data._2_1_ = k1ptr[2];
    data._3_1_ = k1ptr[3];
    data._0_4_ = ((uint)data * 0x16a88000 | (uint)data * -0x3361d2af >> 0x11) * 0x1b873593;
    data._4_4_ = (((uint)data ^ data._4_4_) << 0xd | ((uint)data ^ data._4_4_) >> 0x13) * 5 +
                 0xe6546b64;
    k1ptr = k1ptr + 4;
  }
  pbVar2 = (byte *)((long)key + (long)(len / 4 << 2));
  data._0_4_ = 0;
  uVar1 = len & 3;
  if (uVar1 != 1) {
    if (uVar1 != 2) {
      if (uVar1 != 3) goto LAB_00106b20;
      data._0_4_ = (uint)pbVar2[2] << 0x10;
    }
    data._0_4_ = (uint)pbVar2[1] << 8 ^ (uint)data;
  }
  data._4_4_ = ((*pbVar2 ^ (uint)data) * 0x16a88000 | (*pbVar2 ^ (uint)data) * -0x3361d2af >> 0x11)
               * 0x1b873593 ^ data._4_4_;
LAB_00106b20:
  uVar1 = ((len ^ data._4_4_) >> 0x10 ^ len ^ data._4_4_) * -0x7a143595;
  uVar1 = (uVar1 >> 0xd ^ uVar1) * -0x3d4d51cb;
  return uVar1 >> 0x10 ^ uVar1;
}

Assistant:

NK_API nk_hash
nk_murmur_hash(const void * key, int len, nk_hash seed)
{
    /* 32-Bit MurmurHash3: https://code.google.com/p/smhasher/wiki/MurmurHash3*/
    #define NK_ROTL(x,r) ((x) << (r) | ((x) >> (32 - r)))

    nk_uint h1 = seed;
    nk_uint k1;
    const nk_byte *data = (const nk_byte*)key;
    const nk_byte *keyptr = data;
    nk_byte *k1ptr;
    const int bsize = sizeof(k1);
    const int nblocks = len/4;

    const nk_uint c1 = 0xcc9e2d51;
    const nk_uint c2 = 0x1b873593;
    const nk_byte *tail;
    int i;

    /* body */
    if (!key) return 0;
    for (i = 0; i < nblocks; ++i, keyptr += bsize) {
        k1ptr = (nk_byte*)&k1;
        k1ptr[0] = keyptr[0];
        k1ptr[1] = keyptr[1];
        k1ptr[2] = keyptr[2];
        k1ptr[3] = keyptr[3];

        k1 *= c1;
        k1 = NK_ROTL(k1,15);
        k1 *= c2;

        h1 ^= k1;
        h1 = NK_ROTL(h1,13);
        h1 = h1*5+0xe6546b64;
    }

    /* tail */
    tail = (const nk_byte*)(data + nblocks*4);
    k1 = 0;
    switch (len & 3) {
        case 3: k1 ^= (nk_uint)(tail[2] << 16); /* fallthrough */
        case 2: k1 ^= (nk_uint)(tail[1] << 8u); /* fallthrough */
        case 1: k1 ^= tail[0];
            k1 *= c1;
            k1 = NK_ROTL(k1,15);
            k1 *= c2;
            h1 ^= k1;
            break;
        default: break;
    }

    /* finalization */
    h1 ^= (nk_uint)len;
    /* fmix32 */
    h1 ^= h1 >> 16;
    h1 *= 0x85ebca6b;
    h1 ^= h1 >> 13;
    h1 *= 0xc2b2ae35;
    h1 ^= h1 >> 16;

    #undef NK_ROTL
    return h1;
}